

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O0

_Bool parse_alpha_component(char **begin,char *end,float *component)

{
  _Bool _Var1;
  float local_34;
  float local_30;
  float local_2c;
  float *pfStack_28;
  float value;
  float *component_local;
  char *end_local;
  char **begin_local;
  
  local_2c = 0.0;
  pfStack_28 = component;
  component_local = (float *)end;
  end_local = (char *)begin;
  _Var1 = plutovg_parse_number(begin,end,&local_2c);
  if (_Var1) {
    _Var1 = plutovg_skip_delim((char **)end_local,(char *)component_local,'%');
    if (_Var1) {
      local_2c = local_2c / 100.0;
    }
    if (0.0 <= local_2c) {
      if (local_2c <= 1.0) {
        local_34 = local_2c;
      }
      else {
        local_34 = 1.0;
      }
      local_30 = local_34;
    }
    else {
      local_30 = 0.0;
    }
    *pfStack_28 = local_30;
    begin_local._7_1_ = true;
  }
  else {
    begin_local._7_1_ = false;
  }
  return begin_local._7_1_;
}

Assistant:

static bool parse_alpha_component(const char** begin, const char* end, float* component)
{
    float value = 0;
    if(!plutovg_parse_number(begin, end, &value))
        return false;
    if(plutovg_skip_delim(begin, end, '%'))
        value /= 100.f;
    *component = plutovg_clamp(value, 0.f, 1.f);
    return true;
}